

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompressBegin_usingDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  uint uVar1;
  void *pvVar2;
  size_t sVar3;
  size_t errcod;
  void *dictEnd;
  size_t dictSize;
  char *dictStart;
  ZSTD_DDict *ddict_local;
  ZSTD_DCtx *dctx_local;
  
  if (ddict != (ZSTD_DDict *)0x0) {
    pvVar2 = ZSTD_DDict_dictContent(ddict);
    sVar3 = ZSTD_DDict_dictSize(ddict);
    dctx->ddictIsCold = (uint)(dctx->dictEnd != (void *)((long)pvVar2 + sVar3));
  }
  dctx_local = (ZSTD_DCtx *)ZSTD_decompressBegin(dctx);
  uVar1 = ERR_isError((size_t)dctx_local);
  if (uVar1 == 0) {
    if (ddict != (ZSTD_DDict *)0x0) {
      ZSTD_copyDDictParameters(dctx,ddict);
    }
    dctx_local = (ZSTD_DCtx *)0x0;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_decompressBegin_usingDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_decompressBegin_usingDDict");
    assert(dctx != NULL);
    if (ddict) {
        const char* const dictStart = (const char*)ZSTD_DDict_dictContent(ddict);
        size_t const dictSize = ZSTD_DDict_dictSize(ddict);
        const void* const dictEnd = dictStart + dictSize;
        dctx->ddictIsCold = (dctx->dictEnd != dictEnd);
        DEBUGLOG(4, "DDict is %s",
                    dctx->ddictIsCold ? "~cold~" : "hot!");
    }
    CHECK_F( ZSTD_decompressBegin(dctx) );
    if (ddict) {   /* NULL ddict is equivalent to no dictionary */
        ZSTD_copyDDictParameters(dctx, ddict);
    }
    return 0;
}